

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

char * __thiscall
sentencepiece::SentencePieceText_SentencePiece::_InternalParse
          (SentencePieceText_SentencePiece *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  string *s;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar6;
  ArenaStringPtr *pAVar7;
  uint uVar8;
  char cVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  byte *local_58;
  InternalMetadata *local_50;
  ExtensionSet *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_58 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
  uVar8 = 0;
  if (!bVar2) {
    local_50 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->surface_;
    local_40 = &this->piece_;
    local_48 = &this->_extensions_;
    uVar8 = 0;
    uVar4 = extraout_RDX;
    do {
      bVar1 = *local_58;
      uVar10 = (uint)bVar1;
      pbVar6 = local_58 + 1;
      if ((char)bVar1 < '\0') {
        uVar10 = ((uint)bVar1 + (uint)*pbVar6 * 0x80) - 0x80;
        if (-1 < (char)*pbVar6) {
          pbVar6 = local_58 + 2;
          goto LAB_001acf76;
        }
        pVar11 = google::protobuf::internal::ReadTagFallback((char *)local_58,uVar10);
        local_58 = (byte *)pVar11.first;
        if (local_58 != (byte *)0x0) {
          uVar10 = pVar11.second;
          goto LAB_001acf7a;
        }
LAB_001ad1cf:
        local_58 = (byte *)0x0;
        break;
      }
LAB_001acf76:
      pVar11._8_8_ = uVar4;
      pVar11.first = (char *)pbVar6;
      local_58 = pbVar6;
LAB_001acf7a:
      pbVar6 = (byte *)pVar11.first;
      cVar9 = (char)uVar10;
      switch(uVar10 >> 3) {
      case 1:
        if (cVar9 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
        pAVar7 = local_40;
        if (((ulong)pvVar5 & 1) != 0) {
          pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
LAB_001ad01b:
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar7,pvVar5);
        local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_58,ctx);
        goto LAB_001ad033;
      case 2:
        if (cVar9 != '\x10') break;
        uVar8 = uVar8 | 4;
        bVar1 = *pbVar6;
        uVar10 = (uint)bVar1;
        pbVar3 = pbVar6 + 1;
        if ((char)bVar1 < '\0') {
          uVar10 = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
          if ((char)*pbVar3 < '\0') {
            pVar11 = google::protobuf::internal::VarintParseSlow32((char *)pbVar6,uVar10);
            local_58 = (byte *)pVar11.first;
            this->id_ = pVar11.second;
            goto LAB_001ad033;
          }
          pbVar3 = pbVar6 + 2;
        }
        this->id_ = uVar10;
        local_58 = pbVar3;
        goto LAB_001ad0b5;
      case 3:
        if (cVar9 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pvVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar7 = local_38;
          if (((ulong)pvVar5 & 1) != 0) {
            pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
          }
          goto LAB_001ad01b;
        }
        break;
      case 4:
        if (cVar9 == ' ') {
          uVar8 = uVar8 | 8;
          bVar1 = *pbVar6;
          uVar10 = (uint)bVar1;
          pbVar3 = pbVar6 + 1;
          if ((char)bVar1 < '\0') {
            uVar10 = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
            if ((char)*pbVar3 < '\0') {
              pVar11 = google::protobuf::internal::VarintParseSlow32((char *)pbVar6,uVar10);
              local_58 = (byte *)pVar11.first;
              this->begin_ = pVar11.second;
              goto LAB_001ad033;
            }
            pbVar3 = pbVar6 + 2;
          }
          this->begin_ = uVar10;
          local_58 = pbVar3;
          goto LAB_001ad0b5;
        }
        break;
      case 5:
        if (cVar9 == '(') {
          uVar8 = uVar8 | 0x10;
          bVar1 = *pbVar6;
          uVar10 = (uint)bVar1;
          pbVar3 = pbVar6 + 1;
          if ((char)bVar1 < '\0') {
            uVar10 = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
            if ((char)*pbVar3 < '\0') {
              pVar11 = google::protobuf::internal::VarintParseSlow32((char *)pbVar6,uVar10);
              local_58 = (byte *)pVar11.first;
              this->end_ = pVar11.second;
              goto LAB_001ad033;
            }
            pbVar3 = pbVar6 + 2;
          }
          this->end_ = uVar10;
          local_58 = pbVar3;
          goto LAB_001ad0b5;
        }
      }
      if ((uVar10 == 0) || ((uVar10 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
        break;
      }
      if (uVar10 < 0x640) {
        if (((ulong)local_50->ptr_ & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(local_50);
          pbVar6 = local_58;
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (((ulong)local_50->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar10,unknown,(char *)pbVar6,ctx);
      }
      else {
        local_58 = (byte *)google::protobuf::internal::ExtensionSet::ParseField
                                     (local_48,(ulong)uVar10,(char *)pbVar6,
                                      (MessageLite *)
                                      _SentencePieceText_SentencePiece_default_instance_,local_50,
                                      ctx);
      }
LAB_001ad033:
      if (local_58 == (byte *)0x0) goto LAB_001ad1cf;
LAB_001ad0b5:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
      uVar4 = extraout_RDX_00;
    } while (!bVar2);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
  return (char *)local_58;
}

Assistant:

const char* SentencePieceText_SentencePiece::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string piece = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_piece();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string surface = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_surface();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 begin = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint32 end = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((1600u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}